

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::TruncateStdoutStderr(void)

{
  int32 iVar1;
  int64 keep;
  int64 limit;
  
  iVar1 = MaxLogSize();
  TruncateLogFile("/proc/self/fd/1",(long)(iVar1 << 0x14),0x100000);
  TruncateLogFile("/proc/self/fd/2",(long)(iVar1 << 0x14),0x100000);
  return;
}

Assistant:

void TruncateStdoutStderr() {
#ifdef HAVE_UNISTD_H
  int64 limit = MaxLogSize() << 20;
  int64 keep = 1 << 20;
  TruncateLogFile("/proc/self/fd/1", limit, keep);
  TruncateLogFile("/proc/self/fd/2", limit, keep);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}